

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlitFboCase::init(BlitFboCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  float fVar2;
  code *pcVar3;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data_01;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_02;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_03;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_04;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int extraout_EAX;
  RenderTarget *pRVar15;
  RenderContext *pRVar16;
  deUint32 extraout_var;
  TestLog *pTVar17;
  MessageBuilder *pMVar18;
  ContextInfo *this_00;
  NotSupportedError *pNVar19;
  MovePtr *pMVar20;
  ObjectWrapper *pOVar21;
  ShaderProgram *pSVar22;
  ProgramSources *pPVar23;
  TestError *this_01;
  int *piVar24;
  float *pfVar25;
  float *pfVar26;
  char *code;
  float fVar27;
  undefined7 in_stack_fffffffffffff698;
  undefined1 in_stack_fffffffffffff69f;
  undefined8 in_stack_fffffffffffff6a0;
  int dstY;
  int dstX;
  int dstHeight;
  int dstWidth;
  int srcY_1;
  int srcX_1;
  int srcHeight_1;
  int srcWidth_1;
  int srcY;
  int srcX;
  int srcHeight;
  int srcWidth;
  IVec2 unionSize;
  BlitArgs args;
  int ndx;
  Vector<int,_2> local_4c4;
  IVec2 dstSize;
  IVec2 srcSize;
  allocator<char> local_489;
  string local_488;
  DefaultDeleter<glu::ShaderProgram> local_462;
  undefined1 local_461;
  string local_460;
  ShaderSource local_440;
  string local_418;
  ShaderSource local_3f8;
  ProgramSources local_3d0;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_300;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_2f0;
  char *local_2e0;
  char *fragmentSource;
  char *vertexSource;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_2c8;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_2b8;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_> local_2a1;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  local_2a0;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *local_290;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_279;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_278;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_268;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_> local_251;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  local_250;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *local_240;
  undefined1 local_22a;
  allocator<char> local_229;
  string local_228;
  undefined1 local_202;
  allocator<char> local_201;
  string local_200;
  deUint32 local_1dc;
  ContextType local_1d8;
  undefined1 local_1d1;
  char *pcStack_1d0;
  bool supportsES32;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  undefined1 local_30 [8];
  Random rnd;
  Functions *gl;
  bool defaultFBMultisampled;
  int numIterations;
  BlitFboCase *this_local;
  
  pRVar15 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getNumSamples(pRVar15);
  pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar16->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  de::Random::Random((Random *)local_30,0xabc123);
  pTVar17 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1b0,pTVar17,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar18 = tcu::MessageBuilder::operator<<
                      (&local_1b0,(char (*) [41])"Using BlitFramebuffer to blit area from ");
  local_1c8[0] = "fbo";
  if (this->m_src == TARGET_DEFAULT) {
    local_1c8[0] = "default fb";
  }
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,local_1c8);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [5])0x2bfaa9a);
  code = "default fb";
  pcStack_1d0 = "fbo";
  if (this->m_dst == TARGET_DEFAULT) {
    pcStack_1d0 = "default fb";
  }
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&stack0xfffffffffffffe30);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [3])0x2c7b265);
  pMVar18 = tcu::MessageBuilder::operator<<
                      (pMVar18,(char (*) [71])
                               "Varying blit arguments and primitive bounding box between iterations.\n"
                      );
  pMVar18 = tcu::MessageBuilder::operator<<
                      (pMVar18,(char (*) [55])
                               "Expecting bounding box to have no effect on blitting.\n");
  pMVar18 = tcu::MessageBuilder::operator<<
                      (pMVar18,(char (*) [54])
                               "Source framebuffer is filled with green-yellow grid.\n");
  tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_1d8.super_ApiType.m_bits = (ApiType)(*pRVar16->_vptr_RenderContext[2])();
  local_1dc = (deUint32)glu::ApiType::es(3,2);
  local_1d1 = glu::contextSupports(local_1d8,(ApiType)local_1dc);
  if (!(bool)local_1d1) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar4 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_primitive_bounding_box");
    if (!bVar4) {
      local_202 = 1;
      pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"Test requires GL_EXT_primitive_bounding_box extension",
                 &local_201);
      tcu::NotSupportedError::NotSupportedError(pNVar19,&local_200);
      local_202 = 0;
      __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((this->m_dst == TARGET_DEFAULT) && (1 < iVar5)) {
    local_22a = 1;
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Test requires non-multisampled default framebuffer",&local_229)
    ;
    tcu::NotSupportedError::NotSupportedError(pNVar19,&local_228);
    local_22a = 0;
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (this->m_src == TARGET_FBO) {
    pMVar20 = (MovePtr *)operator_new(0x18);
    pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)2> *)pMVar20,pRVar16);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>::DefaultDeleter(&local_251);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               *)&local_250);
    local_240 = de::details::MovePtr::operator_cast_to_PtrData(&local_250,pMVar20);
    data.ptr._7_1_ = in_stack_fffffffffffff69f;
    data.ptr._0_7_ = in_stack_fffffffffffff698;
    data._8_8_ = in_stack_fffffffffffff6a0;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::operator=(&this->m_srcRbo,data);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                *)&local_250);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0xa0);
    pOVar21 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*(&(this->m_srcRbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                          )->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(pOVar21);
    (*pcVar3)(0x8d41,dVar6);
    (**(code **)(rnd.m_rnd._8_8_ + 0x1238))(0x8d41,0x8058,0x100);
    dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    glu::checkError(dVar6,"src rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd39);
    pMVar20 = (MovePtr *)operator_new(0x18);
    pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)3> *)pMVar20,pRVar16);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_279);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               *)&local_278);
    local_268 = de::details::MovePtr::operator_cast_to_PtrData(&local_278,pMVar20);
    data_00.ptr._7_1_ = in_stack_fffffffffffff69f;
    data_00.ptr._0_7_ = in_stack_fffffffffffff698;
    data_00._8_8_ = in_stack_fffffffffffff6a0;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::operator=(&this->m_srcFbo,data_00);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                *)&local_278);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x78);
    pOVar21 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ::operator*(&(this->m_srcFbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                          )->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(pOVar21);
    (*pcVar3)(0x8d40,dVar6);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x688);
    pOVar21 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*(&(this->m_srcRbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                          )->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(pOVar21);
    (*pcVar3)(0x8d40,0x8ce0,0x8d41,dVar6);
    dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    code = (char *)0xd3e;
    glu::checkError(dVar6,"src fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd3e);
  }
  if (this->m_dst == TARGET_FBO) {
    pMVar20 = (MovePtr *)operator_new(0x18);
    pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)2> *)pMVar20,pRVar16);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>::DefaultDeleter(&local_2a1);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               *)&local_2a0);
    local_290 = de::details::MovePtr::operator_cast_to_PtrData(&local_2a0,pMVar20);
    data_01.ptr._7_1_ = in_stack_fffffffffffff69f;
    data_01.ptr._0_7_ = in_stack_fffffffffffff698;
    data_01._8_8_ = in_stack_fffffffffffff6a0;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::operator=(&this->m_dstRbo,data_01);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                *)&local_2a0);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0xa0);
    pOVar21 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*(&(this->m_dstRbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                          )->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(pOVar21);
    (*pcVar3)(0x8d41,dVar6);
    (**(code **)(rnd.m_rnd._8_8_ + 0x1238))(0x8d41,0x8058,0x100);
    dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    glu::checkError(dVar6,"dst rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd46);
    pMVar20 = (MovePtr *)operator_new(0x18);
    pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)3> *)pMVar20,pRVar16);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter
              ((DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> *)
               ((long)&vertexSource + 7));
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               *)&local_2c8);
    local_2b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_2c8,pMVar20);
    data_02.ptr._7_1_ = in_stack_fffffffffffff69f;
    data_02.ptr._0_7_ = in_stack_fffffffffffff698;
    data_02._8_8_ = in_stack_fffffffffffff6a0;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::operator=(&this->m_dstFbo,data_02);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                *)&local_2c8);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x78);
    pOVar21 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ::operator*(&(this->m_dstFbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                          )->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(pOVar21);
    (*pcVar3)(0x8d40,dVar6);
    pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x688);
    pOVar21 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*(&(this->m_dstRbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                          )->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(pOVar21);
    (*pcVar3)(0x8d40,0x8ce0,0x8d41,dVar6);
    dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    code = (char *)0xd4b;
    glu::checkError(dVar6,"dst fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd4b);
  }
  fragmentSource =
       "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}\n"
  ;
  local_2e0 = 
  "${GLSL_VERSION_DECL}\nin mediump vec4 v_position;\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main()\n{\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tdEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n}\n"
  ;
  pSVar22 = (ShaderProgram *)operator_new(0xd0);
  local_461 = 1;
  pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_3d0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_418,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}\n"
             ,code);
  glu::VertexSource::VertexSource((VertexSource *)&local_3f8,&local_418);
  pPVar23 = glu::ProgramSources::operator<<(&local_3d0,&local_3f8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_460,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_position;\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main()\n{\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tdEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n}\n"
             ,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_440,&local_460);
  pPVar23 = glu::ProgramSources::operator<<(pPVar23,&local_440);
  glu::ShaderProgram::ShaderProgram(pSVar22,pRVar16,pPVar23);
  local_461 = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_462);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_300);
  local_2f0 = de::details::MovePtr::operator_cast_to_PtrData(&local_300,(MovePtr *)pSVar22);
  data_03.ptr._7_1_ = in_stack_fffffffffffff69f;
  data_03.ptr._0_7_ = in_stack_fffffffffffff698;
  data_03._8_8_ = in_stack_fffffffffffff6a0;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data_03);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_300);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  glu::VertexSource::~VertexSource((VertexSource *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  glu::ProgramSources::~ProgramSources(&local_3d0);
  pSVar22 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  bVar4 = glu::ShaderProgram::isOk(pSVar22);
  if (!bVar4) {
    pTVar17 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pSVar22 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator*(&(this->m_program).
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
    glu::operator<<(pTVar17,pSVar22);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"failed to build program",&local_489);
    tcu::TestError::TestError(this_01,&local_488);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (Functional::(anonymous_namespace)::BlitFboCase::init()::s_quadCoords == '\0') {
    iVar7 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::BlitFboCase::init()::
                                 s_quadCoords);
    if (iVar7 != 0) {
      tcu::Vector<float,_4>::Vector(init::s_quadCoords,-1.0,-1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(init::s_quadCoords + 1,-1.0,1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(init::s_quadCoords + 2,1.0,-1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(init::s_quadCoords + 3,1.0,1.0,0.0,1.0);
      __cxa_guard_release(&Functional::(anonymous_namespace)::BlitFboCase::init()::s_quadCoords);
    }
  }
  pMVar20 = (MovePtr *)operator_new(0x18);
  pRVar16 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)pMVar20,pRVar16);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>::DefaultDeleter
            ((DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_> *)
             ((long)srcSize.m_data + 3));
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)(srcSize.m_data + 1));
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
              *)(srcSize.m_data + 1),pMVar20);
  data_04.ptr._7_1_ = in_stack_fffffffffffff69f;
  data_04.ptr._0_7_ = in_stack_fffffffffffff698;
  data_04._8_8_ = in_stack_fffffffffffff6a0;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::operator=(&this->m_vbo,data_04);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
              *)(srcSize.m_data + 1));
  pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0x40);
  pOVar21 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             ::operator*(&(this->m_vbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        )->super_ObjectWrapper;
  dVar6 = glu::ObjectWrapper::operator*(pOVar21);
  (*pcVar3)(0x8892,dVar6);
  (**(code **)(rnd.m_rnd._8_8_ + 0x150))(0x8892,0x40,init::s_quadCoords,0x88e4);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"set buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xd77);
  if (this->m_src == TARGET_DEFAULT) {
    pRVar15 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar7 = tcu::RenderTarget::getWidth(pRVar15);
    pRVar15 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar8 = tcu::RenderTarget::getHeight(pRVar15);
    tcu::Vector<int,_2>::Vector(&dstSize,iVar7,iVar8);
  }
  else {
    tcu::Vector<int,_2>::Vector(&dstSize,0x100,0x100);
  }
  if (this->m_dst == TARGET_DEFAULT) {
    pRVar15 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar7 = tcu::RenderTarget::getWidth(pRVar15);
    pRVar15 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar8 = tcu::RenderTarget::getHeight(pRVar15);
    tcu::Vector<int,_2>::Vector(&local_4c4,iVar7,iVar8);
  }
  else {
    tcu::Vector<int,_2>::Vector(&local_4c4,0x100,0x100);
  }
  pTVar17 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&args.linear,pTVar17,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar18 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&args.linear,(char (*) [11])"srcSize = ");
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&dstSize);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [2])0x2b8f97b);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [11])"dstSize = ");
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_4c4);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&args.linear);
  for (args.bboxMax.m_data[3] = 0.0; (int)args.bboxMax.m_data[3] < 0xc;
      args.bboxMax.m_data[3] = (float)((int)args.bboxMax.m_data[3] + 1)) {
    BlitArgs::BlitArgs((BlitArgs *)&unionSize);
    if ((this->m_src == TARGET_DEFAULT) && (1 < iVar5)) {
      iVar7 = tcu::Vector<int,_2>::x(&dstSize);
      iVar8 = tcu::Vector<int,_2>::x(&local_4c4);
      iVar7 = de::min<int>(iVar7,iVar8);
      iVar8 = tcu::Vector<int,_2>::y(&dstSize);
      iVar9 = tcu::Vector<int,_2>::y(&local_4c4);
      iVar8 = de::min<int>(iVar8,iVar9);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&srcHeight,iVar7,iVar8);
      iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&srcHeight);
      iVar7 = de::Random::getInt((Random *)local_30,1,iVar7);
      iVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&srcHeight);
      iVar8 = de::Random::getInt((Random *)local_30,1,iVar8);
      iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&srcHeight);
      iVar9 = de::Random::getInt((Random *)local_30,0,iVar9 - iVar7);
      iVar10 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&srcHeight);
      iVar10 = de::Random::getInt((Random *)local_30,0,iVar10 - iVar8);
      piVar24 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar9;
      piVar24 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar10;
      piVar24 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar9 + iVar7;
      piVar24 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar10 + iVar8;
      args.src.m_data[2] = unionSize.m_data[0];
      args.src.m_data[3] = unionSize.m_data[1];
      args.dst.m_data[0] = args.src.m_data[0];
      args.dst.m_data[1] = args.src.m_data[1];
    }
    else {
      iVar7 = tcu::Vector<int,_2>::x(&dstSize);
      iVar7 = de::Random::getInt((Random *)local_30,1,iVar7);
      iVar8 = tcu::Vector<int,_2>::y(&dstSize);
      iVar8 = de::Random::getInt((Random *)local_30,1,iVar8);
      iVar9 = tcu::Vector<int,_2>::x(&dstSize);
      iVar9 = de::Random::getInt((Random *)local_30,0,iVar9 - iVar7);
      iVar10 = tcu::Vector<int,_2>::y(&dstSize);
      iVar10 = de::Random::getInt((Random *)local_30,0,iVar10 - iVar8);
      iVar11 = tcu::Vector<int,_2>::x(&local_4c4);
      iVar11 = de::Random::getInt((Random *)local_30,1,iVar11);
      iVar12 = tcu::Vector<int,_2>::y(&local_4c4);
      iVar12 = de::Random::getInt((Random *)local_30,1,iVar12);
      iVar13 = tcu::Vector<int,_2>::x(&local_4c4);
      iVar13 = de::Random::getInt((Random *)local_30,-(iVar11 / 2),
                                  iVar13 - ((iVar11 + 1) - (iVar11 + 1 >> 0x1f) >> 1));
      iVar14 = tcu::Vector<int,_2>::y(&local_4c4);
      iVar14 = de::Random::getInt((Random *)local_30,-(iVar12 / 2),
                                  iVar14 - ((iVar12 + 1) - (iVar12 + 1 >> 0x1f) >> 1));
      piVar24 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar9;
      piVar24 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar10;
      piVar24 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar9 + iVar7;
      piVar24 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&unionSize);
      *piVar24 = iVar10 + iVar8;
      piVar24 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(args.src.m_data + 2));
      *piVar24 = iVar13;
      piVar24 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(args.src.m_data + 2));
      *piVar24 = iVar14;
      piVar24 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(args.src.m_data + 2));
      *piVar24 = iVar13 + iVar11;
      piVar24 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(args.src.m_data + 2));
      *piVar24 = iVar14 + iVar12;
    }
    fVar27 = de::Random::getFloat((Random *)local_30,-1.1,1.1);
    pfVar25 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(args.dst.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,-1.1,1.1);
    pfVar25 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(args.dst.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,-1.1,1.1);
    pfVar25 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(args.dst.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,0.9,1.1);
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.dst.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,-1.1,1.1);
    pfVar25 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,-1.1,1.1);
    pfVar25 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,-1.1,1.1);
    pfVar25 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    *pfVar25 = fVar27;
    fVar27 = de::Random::getFloat((Random *)local_30,0.9,1.1);
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    *pfVar25 = fVar27;
    pfVar25 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(args.dst.m_data + 2));
    fVar27 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.dst.m_data + 2));
    fVar1 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    fVar2 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    if (fVar2 / *pfVar25 < fVar27 / fVar1) {
      pfVar25 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(args.dst.m_data + 2));
      pfVar26 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(args.bboxMin.m_data + 2));
      std::swap<float>(pfVar25,pfVar26);
    }
    pfVar25 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(args.dst.m_data + 2));
    fVar27 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.dst.m_data + 2));
    fVar1 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    fVar2 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    if (fVar2 / *pfVar25 < fVar27 / fVar1) {
      pfVar25 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(args.dst.m_data + 2));
      pfVar26 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(args.bboxMin.m_data + 2));
      std::swap<float>(pfVar25,pfVar26);
    }
    pfVar25 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(args.dst.m_data + 2));
    fVar27 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.dst.m_data + 2));
    fVar1 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    fVar2 = *pfVar25;
    pfVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(args.bboxMin.m_data + 2));
    if (fVar2 / *pfVar25 < fVar27 / fVar1) {
      pfVar25 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(args.dst.m_data + 2));
      pfVar26 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(args.bboxMin.m_data + 2));
      std::swap<float>(pfVar25,pfVar26);
    }
    args.bboxMax.m_data[2]._0_1_ = de::Random::getBool((Random *)local_30);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
    ::push_back(&this->m_iterations,(value_type *)&unionSize);
  }
  de::Random::~Random((Random *)local_30);
  return extraout_EAX;
}

Assistant:

void BlitFboCase::init (void)
{
	const int				numIterations			= 12;
	const bool				defaultFBMultisampled	= (m_context.getRenderTarget().getNumSamples() > 1);
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	de::Random				rnd						(0xABC123);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Using BlitFramebuffer to blit area from "
			<< ((m_src == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< " to "
			<< ((m_dst == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< ".\n"
		<< "Varying blit arguments and primitive bounding box between iterations.\n"
		<< "Expecting bounding box to have no effect on blitting.\n"
		<< "Source framebuffer is filled with green-yellow grid.\n"
		<< tcu::TestLog::EndMessage;

	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_dst == TARGET_DEFAULT && defaultFBMultisampled)
		throw tcu::NotSupportedError("Test requires non-multisampled default framebuffer");

	// resources

	if (m_src == TARGET_FBO)
	{
		m_srcRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_srcRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src rbo");

		m_srcFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_srcFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_srcRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src fbo");
	}

	if (m_dst == TARGET_FBO)
	{
		m_dstRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_dstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst rbo");

		m_dstFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_dstFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_dstRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst fbo");
	}

	{
		const char* const vertexSource =	"${GLSL_VERSION_DECL}\n"
													"in highp vec4 a_position;\n"
													"out highp vec4 v_position;\n"
													"void main()\n"
													"{\n"
													"	gl_Position = a_position;\n"
													"	v_position = a_position;\n"
													"}\n";
		const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"in mediump vec4 v_position;\n"
													"layout(location=0) out mediump vec4 dEQP_FragColor;\n"
													"void main()\n"
													"{\n"
													"	const mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
													"	const mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
													"	dEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n"
													"}\n";

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, vertexSource)) << glu::FragmentSource(specializeShader(m_context, fragmentSource))));

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("failed to build program");
		}
	}

	{
		static const tcu::Vec4 s_quadCoords[] =
		{
			tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		};

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));

		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set buf");
	}

	// gen iterations

	{
		const tcu::IVec2 srcSize = (m_src == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));
		const tcu::IVec2 dstSize = (m_dst == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "srcSize = " << srcSize << "\n"
			<< "dstSize = " << dstSize << "\n"
			<< tcu::TestLog::EndMessage;

		for (int ndx = 0; ndx < numIterations; ++ndx)
		{
			BlitArgs args;

			if (m_src == TARGET_DEFAULT && defaultFBMultisampled)
			{
				const tcu::IVec2	unionSize	= tcu::IVec2(de::min(srcSize.x(), dstSize.x()), de::min(srcSize.y(), dstSize.y()));
				const int			srcWidth	= rnd.getInt(1, unionSize.x());
				const int			srcHeight	= rnd.getInt(1, unionSize.y());
				const int			srcX		= rnd.getInt(0, unionSize.x() - srcWidth);
				const int			srcY		= rnd.getInt(0, unionSize.y() - srcHeight);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;

				args.dst = args.src;
			}
			else
			{
				const int	srcWidth	= rnd.getInt(1, srcSize.x());
				const int	srcHeight	= rnd.getInt(1, srcSize.y());
				const int	srcX		= rnd.getInt(0, srcSize.x() - srcWidth);
				const int	srcY		= rnd.getInt(0, srcSize.y() - srcHeight);
				const int	dstWidth	= rnd.getInt(1, dstSize.x());
				const int	dstHeight	= rnd.getInt(1, dstSize.y());
				const int	dstX		= rnd.getInt(-(dstWidth / 2), dstSize.x() - (dstWidth+1) / 2);		// allow dst go out of bounds
				const int	dstY		= rnd.getInt(-(dstHeight / 2), dstSize.y() - (dstHeight+1)  / 2);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;
				args.dst.x() = dstX;
				args.dst.y() = dstY;
				args.dst.z() = dstX + dstWidth;
				args.dst.w() = dstY + dstHeight;
			}

			args.bboxMin.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.w() = rnd.getFloat( 0.9f, 1.1f);

			args.bboxMax.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.w() = rnd.getFloat( 0.9f, 1.1f);

			if (args.bboxMin.x() / args.bboxMin.w() > args.bboxMax.x() / args.bboxMax.w())
				std::swap(args.bboxMin.x(), args.bboxMax.x());
			if (args.bboxMin.y() / args.bboxMin.w() > args.bboxMax.y() / args.bboxMax.w())
				std::swap(args.bboxMin.y(), args.bboxMax.y());
			if (args.bboxMin.z() / args.bboxMin.w() > args.bboxMax.z() / args.bboxMax.w())
				std::swap(args.bboxMin.z(), args.bboxMax.z());

			args.linear = rnd.getBool();

			m_iterations.push_back(args);
		}
	}
}